

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O3

int hostkey_method_ssh_ecdsa_initPEM
              (LIBSSH2_SESSION *session,char *privkeyfile,uchar *passphrase,void **abstract)

{
  int iVar1;
  EVP_PKEY *ec_ctx;
  EVP_PKEY *local_30;
  
  local_30 = (EVP_PKEY *)0x0;
  if (abstract == (void **)0x0) {
    iVar1 = _libssh2_ecdsa_new_private(&local_30,session,privkeyfile,passphrase);
  }
  else {
    if ((EVP_PKEY *)*abstract != (EVP_PKEY *)0x0) {
      EVP_PKEY_free((EVP_PKEY *)*abstract);
      *abstract = (void *)0x0;
    }
    iVar1 = _libssh2_ecdsa_new_private(&local_30,session,privkeyfile,passphrase);
    *abstract = local_30;
  }
  return iVar1;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_initPEM(LIBSSH2_SESSION * session,
                                 const char *privkeyfile,
                                 unsigned const char *passphrase,
                                 void **abstract)
{
    libssh2_ecdsa_ctx *ec_ctx = NULL;
    int ret;

    if(abstract && *abstract) {
        hostkey_method_ssh_ecdsa_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_ecdsa_new_private(&ec_ctx, session,
                                     privkeyfile, passphrase);

    if(abstract)
        *abstract = ec_ctx;

    return ret;
}